

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::shader_multisample_interpolation
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  string shaderSource;
  string shaderSource_00;
  bool bVar3;
  size_t sVar4;
  bool bVar5;
  long lVar6;
  ostringstream source;
  undefined1 *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  long in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  long *local_1c8;
  ExpectResult local_1c0;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  paVar1 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,
             "GL_OES_shader_multisample_interpolation features require enabling the extension in 310 es shaders."
             ,"");
  NegativeTestContext::beginSection(ctx,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"Test sample in/out qualifiers.","");
  NegativeTestContext::beginSection(ctx,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  lVar6 = 0;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#version 310 es\n\t",0x11);
    pcVar2 = shader_multisample_interpolation::s_sampleTests[lVar6];
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nprecision mediump float;\nvoid main()\n{\n}\n",0x2a);
    std::__cxx11::stringbuf::str();
    shaderSource._M_string_length = in_stack_fffffffffffffe20;
    shaderSource._M_dataplus._M_p = in_stack_fffffffffffffe18;
    shaderSource.field_2._M_allocated_capacity = in_stack_fffffffffffffe28;
    shaderSource.field_2._8_8_ = in_stack_fffffffffffffe30;
    verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)&DAT_00000001,(ShaderType)local_1c8,
                 shaderSource,local_1c0);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar6 = 1;
    bVar3 = false;
  } while (bVar5);
  NegativeTestContext::endSection(ctx);
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"Test interpolateAt* functions.","");
  NegativeTestContext::beginSection(ctx,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  lVar6 = 0;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "#version 310 es\nin mediump float interpolant;\nprecision mediump float;\nvoid main()\n{\n\t"
               ,0x56);
    pcVar2 = shader_multisample_interpolation::s_interpolateAtTests[lVar6];
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n}\n",3);
    std::__cxx11::stringbuf::str();
    shaderSource_00._M_string_length = in_stack_fffffffffffffe20;
    shaderSource_00._M_dataplus._M_p = in_stack_fffffffffffffe18;
    shaderSource_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe28;
    shaderSource_00.field_2._8_8_ = in_stack_fffffffffffffe30;
    verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)&DAT_00000001,
                 (ShaderType)in_stack_fffffffffffffe18,shaderSource_00,
                 (ExpectResult)in_stack_fffffffffffffe20);
    if (in_stack_fffffffffffffe18 != &stack0xfffffffffffffe28) {
      operator_delete(in_stack_fffffffffffffe18,in_stack_fffffffffffffe28 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar6 = 1;
    bVar3 = false;
  } while (bVar5);
  NegativeTestContext::endSection(ctx);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void shader_multisample_interpolation (NegativeTestContext& ctx)
{
	static const char* const s_sampleTests[] =
	{
		"sample in highp float v_var;",
		"sample out highp float v_var;"
	};

	static const char* const s_interpolateAtTests[] =
	{
		"interpolateAtCentroid(interpolant);",
		"interpolateAtSample(interpolant, 1);",
		"interpolateAtOffset(interpolant, vec2(1.0, 0.0));"
	};

	ctx.beginSection("GL_OES_shader_multisample_interpolation features require enabling the extension in 310 es shaders.");
	ctx.beginSection("Test sample in/out qualifiers.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_sampleTests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"	" << s_sampleTests[ndx] << "\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();

	ctx.beginSection("Test interpolateAt* functions.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_sampleTests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"in mediump float interpolant;\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"	" << s_interpolateAtTests[ndx] << "\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
	ctx.endSection();
}